

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int gap_lr_spill_cost(gen_ctx_t gen_ctx,live_range_t_conflict lr)

{
  void **ppvVar1;
  bb_t *ppbVar2;
  undefined1 auVar3 [32];
  byte bVar4;
  bitmap_t pVVar5;
  in_edge_t_conflict peVar6;
  MIR_item_t pMVar7;
  MIR_reg_t *pMVar8;
  HTAB_MIR_item_t *pHVar9;
  VARR_MIR_reg_t *pVVar10;
  bb_t pbVar11;
  ra_ctx *prVar12;
  FILE *pFVar13;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  MIR_context_t pMVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  MIR_op_mode_t MVar25;
  MIR_type_t MVar26;
  MIR_reg_t MVar27;
  ulong in_RAX;
  in_edge_t peVar28;
  ulong uVar29;
  MIR_insn_t_conflict pMVar30;
  int64_t iVar31;
  MIR_insn_t_conflict insn;
  gen_ctx_t pgVar32;
  undefined1 (*pauVar33) [32];
  uint uVar34;
  MIR_context_t in_RCX;
  bb_t pbVar35;
  MIR_context_t pMVar36;
  ulong uVar37;
  MIR_disp_t disp;
  MIR_reg_t base_reg;
  in_edge_t extraout_RDX;
  DLIST_in_edge_t *pDVar38;
  gen_ctx_t unaff_RBX;
  gen_ctx_t pgVar39;
  long lVar40;
  gen_ctx_t unaff_RBP;
  gen_ctx_t pgVar41;
  gen_ctx_t pgVar42;
  ulong uVar43;
  uint uVar44;
  gen_ctx_t in_R8;
  ulong uVar46;
  gen_ctx_t unaff_R12;
  gen_ctx_t pgVar47;
  DLIST_LINK_bb_t *pDVar48;
  bb_t unaff_R13;
  uint *puVar49;
  ulong uVar50;
  out_edge_t unaff_R14;
  in_edge_t_conflict peVar51;
  MIR_context_t ctx;
  gen_ctx_t unaff_R15;
  size_t sVar52;
  bool bVar53;
  lr_gap_t el;
  uint uStack_2d4;
  ulong uStack_2b8;
  int iStack_2ac;
  MIR_context_t pMStack_2a8;
  DLIST_LINK_bb_t *pDStack_2a0;
  uint uStack_294;
  MIR_context_t pMStack_290;
  ulong uStack_288;
  size_t sStack_280;
  MIR_op_t MStack_278;
  uint *puStack_240;
  MIR_op_t MStack_238;
  MIR_op_t MStack_208;
  bb_t pbStack_1d8;
  bb_t pbStack_1d0;
  in_edge_t_conflict peStack_1c8;
  in_edge_t_conflict peStack_1c0;
  out_edge_t peStack_1b8;
  out_edge_t peStack_1b0;
  bb_insn_t pbStack_1a8;
  bb_insn_t pbStack_1a0;
  bitmap_t pVStack_198;
  bitmap_t pVStack_190;
  bitmap_t pVStack_188;
  bitmap_t pVStack_180;
  int aiStack_178 [12];
  undefined1 auStack_148 [16];
  undefined1 auStack_138 [16];
  undefined1 auStack_128 [16];
  gen_ctx_t pgStack_e0;
  gen_ctx_t pgStack_d8;
  bb_t pbStack_d0;
  in_edge_t_conflict peStack_c8;
  gen_ctx_t pgStack_c0;
  gen_ctx_t pgStack_b8;
  gen_ctx_t pgStack_b0;
  MIR_context_t pMStack_a8;
  gen_ctx_t pgStack_a0;
  in_edge_t peStack_98;
  bb_t pbStack_90;
  uint uStack_88;
  uint uStack_84;
  gen_ctx_t pgStack_80;
  gen_ctx_t pgStack_78;
  ulong uStack_70;
  gen_ctx_t pgStack_68;
  gen_ctx_t pgStack_60;
  bb_t pbStack_58;
  out_edge_t peStack_50;
  gen_ctx_t pgStack_48;
  gen_ctx_t pgStack_40;
  ulong local_38;
  gen_ctx_t pgVar45;
  
  pVVar5 = gen_ctx->temp_bitmap;
  pgVar42 = (gen_ctx_t)lr;
  pgVar45 = gen_ctx;
  local_38 = in_RAX;
  if ((pVVar5 != (bitmap_t)0x0) && (pVVar5->varr != (bitmap_el_t *)0x0)) {
    pVVar5->els_num = 0;
    unaff_R12 = (gen_ctx_t)lr->lr_bb;
    if (unaff_R12 != (gen_ctx_t)0x0) {
      unaff_R13 = (bb_t)&DAT_00000001;
      do {
        unaff_R15 = (gen_ctx_t)gen_ctx->temp_bitmap;
        unaff_RBP = unaff_R12->ctx->gen_ctx;
        pgVar42 = (gen_ctx_t)((long)&unaff_RBP->ctx + 1);
        pgStack_40 = (gen_ctx_t)0x1703da;
        pgVar45 = unaff_R15;
        bitmap_expand((bitmap_t)unaff_R15,(size_t)pgVar42);
        if (unaff_R15 == (gen_ctx_t)0x0) goto LAB_00170535;
        in_RCX = (MIR_context_t)((ulong)unaff_RBP >> 6);
        ppvVar1 = &unaff_R15->curr_func_item->data + (long)in_RCX;
        *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)unaff_RBP & 0x3f));
        unaff_R12 = *(gen_ctx_t *)&unaff_R12->optimize_level;
      } while (unaff_R12 != (gen_ctx_t)0x0);
    }
    unaff_R13 = (bb_t)lr->lr_bb;
    if (unaff_R13 == (bb_t)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = 0;
      do {
        unaff_R12 = (gen_ctx_t)unaff_R13->index;
        pgStack_40 = (gen_ctx_t)0x170421;
        pgVar45 = unaff_R12;
        uVar22 = bb_loop_level((bb_t_conflict)unaff_R12);
        unaff_R15 = (gen_ctx_t)(ulong)uVar22;
        unaff_RBP = (gen_ctx_t)0xffffffff;
        for (lr = (live_range_t_conflict)((DLIST_out_edge_t *)&unaff_R12->addr_regs)->head;
            iVar24 = (int)unaff_RBP, (out_edge_t)lr != (out_edge_t)0x0;
            lr = (live_range_t_conflict)(((out_edge_t)lr)->out_link).next) {
          pVVar5 = gen_ctx->temp_bitmap;
          if (pVVar5 == (bitmap_t)0x0) {
            pgStack_40 = (gen_ctx_t)0x170530;
            gap_lr_spill_cost_cold_2();
            goto LAB_00170530;
          }
          pgVar45 = (gen_ctx_t)((out_edge_t)lr)->dst;
          in_RCX = pgVar45->ctx;
          if (((MIR_context_t)(pVVar5->els_num << 6) <= in_RCX) ||
             ((pVVar5->varr[(ulong)in_RCX >> 6] >> ((ulong)in_RCX & 0x3f) & 1) == 0)) {
            pgStack_40 = (gen_ctx_t)0x17046d;
            iVar23 = bb_loop_level((bb_t_conflict)pgVar45);
            in_RCX = (MIR_context_t)(ulong)(iVar23 + 1U);
            if (iVar24 <= iVar23) {
              unaff_RBP = (gen_ctx_t)(ulong)(iVar23 + 1U);
            }
          }
        }
        uVar22 = uVar22 + 1;
        unaff_R15 = (gen_ctx_t)(ulong)uVar22;
        if (-1 < iVar24) {
          if ((int)uVar22 <= iVar24) {
            unaff_RBP = unaff_R15;
          }
          local_38 = (ulong)(uint)((int)local_38 + (int)unaff_RBP * 2);
        }
        unaff_RBP = (gen_ctx_t)0xffffffff;
        for (lr = (live_range_t_conflict)((DLIST_in_edge_t *)&unaff_R12->addr_insn_p)->head;
            uVar44 = (uint)unaff_RBP, (out_edge_t)lr != (out_edge_t)0x0;
            lr = (live_range_t_conflict)(((out_edge_t)lr)->in_link).next) {
          pVVar5 = gen_ctx->temp_bitmap;
          if (pVVar5 == (bitmap_t)0x0) goto LAB_00170530;
          pgVar45 = (gen_ctx_t)((out_edge_t)lr)->src;
          in_RCX = pgVar45->ctx;
          if (((MIR_context_t)(pVVar5->els_num << 6) <= in_RCX) ||
             ((pVVar5->varr[(ulong)in_RCX >> 6] >> ((ulong)in_RCX & 0x3f) & 1) == 0)) {
            pgStack_40 = (gen_ctx_t)0x1704dc;
            iVar24 = bb_loop_level((bb_t_conflict)pgVar45);
            in_RCX = (MIR_context_t)(ulong)(iVar24 + 1U);
            if ((int)uVar44 <= iVar24) {
              unaff_RBP = (gen_ctx_t)(ulong)(iVar24 + 1U);
            }
          }
        }
        if (-1 < (int)uVar44) {
          if ((int)uVar44 < (int)uVar22) {
            uVar22 = uVar44;
          }
          local_38 = (ulong)((int)local_38 + uVar22 * 2);
        }
        unaff_R13 = (bb_t)unaff_R13->pre;
      } while (unaff_R13 != (bb_t)0x0);
    }
    return (int)local_38;
  }
LAB_0017053a:
  pgStack_40 = (gen_ctx_t)HTAB_lr_gap_t_do;
  gap_lr_spill_cost_cold_4();
  peVar51 = (in_edge_t_conflict)pgVar45->tied_regs;
  pgStack_a0 = pgVar42;
  pgStack_68 = unaff_RBX;
  pgStack_60 = unaff_R12;
  pbStack_58 = unaff_R13;
  peStack_50 = unaff_R14;
  pgStack_48 = unaff_R15;
  pgStack_40 = unaff_RBP;
  if (peVar51 == (in_edge_t_conflict)0x0) {
    pgStack_b8 = (gen_ctx_t)0x1708ad;
    HTAB_lr_gap_t_do_cold_8();
    pMVar36 = in_RCX;
    in_R8 = unaff_R15;
LAB_001708ad:
    pgStack_b8 = (gen_ctx_t)0x1708b2;
    HTAB_lr_gap_t_do_cold_7();
LAB_001708b2:
    pgStack_b8 = (gen_ctx_t)0x1708b7;
    HTAB_lr_gap_t_do_cold_2();
    pgVar41 = unaff_RBP;
    pgVar47 = unaff_R12;
    pbVar35 = unaff_R13;
LAB_001708b7:
    pgStack_b8 = (gen_ctx_t)0x1708bc;
    HTAB_lr_gap_t_do_cold_1();
    pgVar39 = unaff_RBX;
LAB_001708bc:
    pgStack_b8 = (gen_ctx_t)0x1708c1;
    HTAB_lr_gap_t_do_cold_4();
LAB_001708c1:
    pgStack_b8 = (gen_ctx_t)0x1708c6;
    HTAB_lr_gap_t_do_cold_6();
  }
  else {
    peVar6 = ((DLIST_in_edge_t *)&pgVar45->addr_insn_p)->head;
    pMVar36 = in_RCX;
    if (peVar6 == (in_edge_t_conflict)0x0) goto LAB_001708ad;
    pgVar47 = (gen_ctx_t)((ulong)in_RCX & 0xffffffff);
    pgVar32 = (gen_ctx_t)peVar51->src;
    pMVar36 = (MIR_context_t)pgVar45->curr_func_item;
    uVar22 = (int)in_RCX - 1;
    pgVar41 = (gen_ctx_t)(ulong)uVar22;
    pgStack_b0 = pgVar45;
    pMStack_a8 = pMVar36;
    peStack_98 = extraout_RDX;
    if (1 < uVar22) {
LAB_001706df:
      pgStack_b8 = (gen_ctx_t)0x1706f5;
      iVar24 = (*(code *)pgStack_b0->debug_file)(pgStack_a0,peStack_98,pMStack_a8);
      uVar44 = iVar24 + (uint)(iVar24 == 0);
      pgVar45 = (gen_ctx_t)(ulong)uVar44;
      unaff_RBX = pgVar32;
      unaff_RBP = pgVar41;
      pgVar42 = pgStack_b0;
      unaff_R12 = pgVar47;
      if ((in_edge_t_conflict)pgStack_b0->tied_regs == (in_edge_t_conflict)0x0) goto LAB_001708b2;
      pMVar36 = (MIR_context_t)((DLIST_in_edge_t *)&pgStack_b0->addr_insn_p)->head;
      pbVar35 = unaff_R13;
      uStack_88 = uVar22;
      pgStack_78 = pgVar47;
      if (pMVar36 != (MIR_context_t)0x0) {
        uVar50 = (ulong)((int)pgVar32 - 1);
        peVar28 = (((in_edge_t_conflict)pgStack_b0->tied_regs)->in_link).prev;
        pMVar7 = ((DLIST_LINK_MIR_item_t *)&pMVar36->error_func)->prev;
        pbStack_90 = (bb_t)(uint *)0x0;
        uVar22 = uVar44;
        uStack_84 = uVar44;
        pgStack_80 = in_R8;
        uStack_70 = uVar50;
        do {
          uVar22 = uVar22 & (uint)uVar50;
          puVar49 = (uint *)((long)&peVar28->src + (ulong)uVar22 * 4);
          uVar29 = (ulong)*puVar49;
          pbVar35 = (bb_t)puVar49;
          if (uVar29 != 0xfffffffe) {
            if (*puVar49 == 0xffffffff) {
              if (1 < uStack_88) {
                return 0;
              }
              *(int *)&pgVar42->ctx = *(int *)&pgVar42->ctx + 1;
              if (pbStack_90 != (bb_t)0x0) {
                puVar49 = (uint *)pbStack_90;
              }
              uVar50 = (ulong)(uint)*(size_t *)&pgVar42->optimize_level;
              *(int *)(&pMVar7->data + uVar50 * 3) = (int)pgVar45;
              (&pMVar7->module)[uVar50 * 3] = (MIR_module_t)pgStack_a0;
              *(in_edge_t *)((long)&pMVar7->item_link + uVar50 * 0x18) = peStack_98;
              uVar22 = (uint)*(size_t *)&pgVar42->optimize_level;
              pgVar42->optimize_level = uVar22 + 1;
              *puVar49 = uVar22;
              pgStack_80->ctx = (MIR_context_t)pgStack_a0;
              *(in_edge_t *)&pgStack_80->optimize_level = peStack_98;
              return 0;
            }
            pbVar35 = pbStack_90;
            if (*(int *)(&pMVar7->data + uVar29 * 3) == (int)pgVar45) {
              ppbVar2 = (bb_t *)(&pMVar7->data + uVar29 * 3);
              pgStack_b8 = (gen_ctx_t)0x170790;
              iVar24 = (*(code *)((DLIST_LINK_bb_t *)&pgStack_b0->debug_level)->prev)
                                 (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,
                                  pgStack_a0,peStack_98,pMStack_a8);
              pgVar45 = (gen_ctx_t)(ulong)uStack_84;
              pbVar35 = pbStack_90;
              uVar50 = uStack_70;
              pgVar42 = pgStack_b0;
              if (iVar24 != 0) {
                if ((int)pgStack_78 == 3) {
                  *(int *)&pgStack_b0->ctx = *(int *)&pgStack_b0->ctx + -1;
                  *puVar49 = 0xfffffffe;
                  if ((bb_t)pgStack_b0->to_free != (bb_t)0x0) {
                    pgStack_b8 = (gen_ctx_t)0x17087b;
                    (*(code *)pgStack_b0->to_free)
                              (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,pMStack_a8);
                  }
                  *(undefined4 *)ppbVar2 = 0;
                }
                else {
                  if ((int)pgStack_78 == 2) {
                    if ((bb_t)pgStack_b0->to_free != (bb_t)0x0) {
                      pgStack_b8 = (gen_ctx_t)0x17083e;
                      (*(code *)pgStack_b0->to_free)
                                (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,pMStack_a8
                                );
                    }
                    ppbVar2[1] = (bb_t)pgStack_a0;
                    ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev = peStack_98;
                  }
                  peVar28 = ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev;
                  pgStack_80->ctx = (MIR_context_t)ppbVar2[1];
                  *(in_edge_t *)&pgStack_80->optimize_level = peVar28;
                }
                return 1;
              }
            }
          }
          uVar44 = uVar44 >> 0xb;
          uVar22 = uVar44 + 1 + uVar22 * 5;
          *(int *)&pgVar42->field_0xc = *(int *)&pgVar42->field_0xc + 1;
          pbStack_90 = pbVar35;
        } while( true );
      }
      goto LAB_001708b7;
    }
    pgVar39 = (gen_ctx_t)peVar6->src;
    if ((int)*(size_t *)&pgVar45->optimize_level != (int)pgVar39) goto LAB_001706df;
    pgVar45 = (gen_ctx_t)(peVar51->in_link).prev;
    pbVar35 = unaff_R13;
    if (pgVar45 == (gen_ctx_t)0x0) goto LAB_001708c1;
    pbVar35 = (bb_t)(ulong)((uint)pgVar32 * 2);
    if (peVar51->dst != pbVar35) {
      pgVar42 = (gen_ctx_t)((long)pbVar35 * 4);
      pgStack_b8 = (gen_ctx_t)0x1705d1;
      pbStack_90 = pbVar35;
      peVar28 = (in_edge_t)realloc(pgVar45,(size_t)pgVar42);
      (peVar51->in_link).prev = peVar28;
      pbVar35 = pbStack_90;
    }
    peVar51->dst = pbVar35;
    peVar51->src = pbVar35;
    if ((in_edge_t_conflict)pgStack_b0->tied_regs != (in_edge_t_conflict)0x0) {
      if ((int)pbVar35 != 0) {
        pgVar45 = (gen_ctx_t)(((in_edge_t_conflict)pgStack_b0->tied_regs)->in_link).prev;
        pgVar42 = (gen_ctx_t)0xff;
        pgStack_b8 = (gen_ctx_t)0x170612;
        memset(pgVar45,0xff,(ulong)((uint)pgVar32 & 0x7fffffff) << 3);
      }
      peVar51 = ((DLIST_in_edge_t *)&pgStack_b0->addr_insn_p)->head;
      if ((peVar51 != (in_edge_t_conflict)0x0) &&
         (pgVar45 = (gen_ctx_t)(peVar51->in_link).prev, pgVar45 != (gen_ctx_t)0x0)) {
        pgVar39 = (gen_ctx_t)(ulong)(uint)((int)pgVar39 * 2);
        if ((gen_ctx_t)peVar51->dst != pgVar39) {
          pgVar42 = (gen_ctx_t)((long)pgVar39 * 0x18);
          pgStack_b8 = (gen_ctx_t)0x17064d;
          peVar28 = (in_edge_t)realloc(pgVar45,(size_t)pgVar42);
          (peVar51->in_link).prev = peVar28;
        }
        peVar51->dst = (bb_t)pgVar39;
        peVar51->src = (bb_t)pgVar39;
        peVar6 = ((DLIST_in_edge_t *)&pgStack_b0->addr_insn_p)->head;
        if (peVar6 == (in_edge_t_conflict)0x0) goto LAB_001708cb;
        pMVar36 = (MIR_context_t)(peVar6->in_link).prev;
        uVar44 = *(uint *)((long)&pgStack_b0->ctx + 4);
        uVar34 = (uint)*(size_t *)&pgStack_b0->optimize_level;
        *(undefined4 *)&pgStack_b0->ctx = 0;
        pgStack_b0->optimize_level = 0;
        *(undefined4 *)((long)&pgStack_b0->ctx + 4) = 0;
        if (uVar44 < uVar34) {
          peVar51 = (in_edge_t_conflict)((long)&pMVar36->error_func + (ulong)uVar44 * 0x18);
          lVar40 = (ulong)uVar34 - (ulong)uVar44;
          pgVar42 = pgStack_b0;
          do {
            if (*(int *)((long)peVar51 + -0x10) != 0) {
              pgStack_b8 = (gen_ctx_t)0x1706b0;
              el.lr = *(live_range_t_conflict *)peVar51;
              el._0_8_ = *(undefined8 *)((long)peVar51 + -8);
              HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar42,el,HTAB_INSERT,(lr_gap_t *)in_R8);
              pMVar36 = *(MIR_context_t *)peVar51;
              pgStack_b8 = (gen_ctx_t)0x1706ca;
              (*(code *)((DLIST_LINK_bb_t *)&pgStack_b0->debug_level)->prev)
                        (in_R8->ctx,*(size_t *)&in_R8->optimize_level,
                         *(undefined8 *)((long)peVar51 + -8),pMVar36,pMStack_a8);
              pgVar42 = pgStack_b0;
            }
            peVar51 = (in_edge_t_conflict)((long)peVar51 + 0x18);
            lVar40 = lVar40 + -1;
          } while (lVar40 != 0);
        }
        pgVar32 = (gen_ctx_t)((ulong)pbVar35 & 0xffffffff);
        unaff_R13 = pbVar35;
        goto LAB_001706df;
      }
      goto LAB_001708bc;
    }
  }
  pgStack_b8 = (gen_ctx_t)0x1708cb;
  HTAB_lr_gap_t_do_cold_5();
LAB_001708cb:
  pgStack_b8 = (gen_ctx_t)rewrite_insn;
  HTAB_lr_gap_t_do_cold_3();
  ctx = pgVar45->ctx;
  uStack_288 = 0;
  pgStack_e0 = pgVar39;
  pgStack_d8 = pgVar47;
  pbStack_d0 = pbVar35;
  peStack_c8 = peVar51;
  pgStack_c0 = in_R8;
  pgStack_b8 = pgVar41;
  MIR_new_int_op(ctx,0);
  MIR_new_int_op(ctx,0);
  sStack_280 = MIR_insn_nops(ctx,(MIR_insn_t_conflict)pgVar42);
  pDStack_2a0 = (DLIST_LINK_bb_t *)&pgVar42->debug_level;
  puStack_240 = (uint *)((long)&((DLIST_out_edge_t *)&pgVar42->addr_regs)->head + 4);
  uStack_2d4 = 0xffffffff;
  uStack_294 = 0xffffffff;
  iVar24 = 0;
  pMStack_2a8 = pMVar36;
  pMStack_290 = ctx;
LAB_00170986:
  if (sStack_280 != 0) {
    sVar52 = 0;
    puVar49 = puStack_240;
    do {
      MVar25 = MIR_insn_op_mode(ctx,(MIR_insn_t_conflict)pgVar42,sVar52,&iStack_2ac);
      pMVar36 = pMStack_2a8;
      if (((iVar24 != 0) || ((iStack_2ac != 0 && ((char)puVar49[-7] != '\v')))) &&
         ((iStack_2ac == 0 || iVar24 != 1 || ((char)puVar49[-7] == '\v')))) {
        if ((char)puVar49[-7] == '\v') {
          uVar50 = (ulong)puVar49[-1];
          if (uVar50 < 0x22) {
            pVVar5 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar5,uVar50 + 1);
            if (pVVar5 == (bitmap_t)0x0) goto LAB_001720bd;
            *pVVar5->varr = *pVVar5->varr | 1L << (uVar50 & 0x3f);
          }
          uVar50 = (ulong)*puVar49;
          if (uVar50 < 0x22) {
            pVVar5 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar5,uVar50 + 1);
            if (pVVar5 == (bitmap_t)0x0) goto LAB_001720c2;
            *pVVar5->varr = *pVVar5->varr | 1L << (uVar50 & 0x3f);
          }
          uVar22 = puVar49[-1];
          uVar50 = (ulong)uVar22;
          if (uVar50 != 0xffffffff) {
            uVar44 = *puVar49;
            if (uVar44 - 0x22 < 0xffffffdd && 0x21 < uVar22) {
              pVVar10 = pgVar45->ra_ctx->reg_renumber;
              if (((pVVar10 == (VARR_MIR_reg_t *)0x0) ||
                  (pMVar8 = pVVar10->varr, pMVar8 == (MIR_reg_t *)0x0)) ||
                 (pVVar10->els_num <= uVar50)) goto LAB_001720ae;
              if (0x21 < pMVar8[uVar50]) {
                if (pVVar10->els_num <= (ulong)uVar44) goto LAB_001720db;
                if (0x21 < pMVar8[uVar44]) {
                  if (iStack_2ac == 0) {
                    bVar53 = -1 < (int)uStack_2d4;
                    uVar34 = uStack_294;
                    uVar21 = uStack_294;
                    uStack_2d4 = (uint)sVar52;
                    if (bVar53) {
                      __assert_fail("in_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5f,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  else {
                    uVar34 = uStack_2d4;
                    uVar21 = (uint)sVar52;
                    if (-1 < (int)uStack_294) {
                      __assert_fail("out_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5b,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  uStack_294 = uVar21;
                  if ((((int)uVar34 < 0) ||
                      (uVar22 != *(uint *)&pDStack_2a0[(ulong)uVar34 * 3 + 2].prev)) ||
                     (uVar44 != *(uint *)((long)&pDStack_2a0[(ulong)uVar34 * 3 + 2].prev + 4))) {
                    uStack_288 = (ulong)((int)uStack_288 + 2);
                  }
                }
              }
            }
          }
          if (pMStack_2a8 != (MIR_context_t)0x0) {
            if (uVar22 != 0xffffffff) {
              update_live(uVar22,0,(bitmap_t)pMStack_2a8->c2mir_ctx);
              uVar50 = (ulong)puVar49[-1];
              if (0x21 < uVar50) {
                pMVar7 = ((DLIST_LINK_MIR_item_t *)&pMStack_2a8->error_func)->prev;
                if (pMVar7 == (MIR_item_t)0x0) goto LAB_001720d6;
                if ((uVar50 < (ulong)((long)pMVar7->data << 6)) &&
                   (pMVar7 = (pMVar7->item_link).prev, uVar22 = puVar49[-1] >> 6,
                   pbVar35 = (bb_t)(&pMVar7->data)[uVar22],
                   (&pMVar7->data)[uVar22] = (bb_t)((ulong)pbVar35 & ~(1L << (uVar50 & 0x3f))),
                   ((ulong)pbVar35 >> (uVar50 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar45,puVar49[-1],base_reg,(MIR_insn_t)pgVar42,1,0);
                }
              }
            }
            pMVar36 = pMStack_2a8;
            ctx = pMStack_290;
            if (*puVar49 != 0xffffffff) {
              update_live(*puVar49,0,(bitmap_t)pMStack_2a8->c2mir_ctx);
              ctx = pMStack_290;
              uVar50 = (ulong)*puVar49;
              if (0x21 < uVar50) {
                pMVar7 = ((DLIST_LINK_MIR_item_t *)&pMVar36->error_func)->prev;
                if (pMVar7 == (MIR_item_t)0x0) goto LAB_001720d1;
                if ((uVar50 < (ulong)((long)pMVar7->data << 6)) &&
                   (pMVar7 = (pMVar7->item_link).prev, uVar22 = *puVar49 >> 6,
                   pbVar35 = (bb_t)(&pMVar7->data)[uVar22],
                   (&pMVar7->data)[uVar22] = (bb_t)((ulong)pbVar35 & ~(1L << (uVar50 & 0x3f))),
                   ((ulong)pbVar35 >> (uVar50 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar45,*puVar49,base_reg,(MIR_insn_t)pgVar42,1,0);
                }
              }
            }
          }
        }
        else if ((char)puVar49[-7] == '\x02') {
          uVar50 = (ulong)puVar49[-5];
          if (uVar50 < 0x22) {
            pVVar5 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar5,uVar50 + 1);
            if (pVVar5 == (bitmap_t)0x0) goto LAB_001720b8;
            *pVVar5->varr = *pVVar5->varr | 1L << (uVar50 & 0x3f);
            if (pMStack_2a8 != (MIR_context_t)0x0) {
              update_live(puVar49[-5],iStack_2ac,(bitmap_t)pMStack_2a8->c2mir_ctx);
            }
          }
          else {
            if (iStack_2ac == 0) {
              pVVar10 = pgVar45->ra_ctx->reg_renumber;
              if (((pVVar10 == (VARR_MIR_reg_t *)0x0) || (pVVar10->varr == (MIR_reg_t *)0x0)) ||
                 (pVVar10->els_num <= uVar50)) goto LAB_001720b3;
              if (0x21 < pVVar10->varr[uVar50]) {
                uStack_288 = (ulong)((int)uStack_288 + (uint)(MVar25 - MIR_OP_REF < 0xfffffffd));
              }
            }
            ctx = pMStack_290;
            if (pMStack_2a8 != (MIR_context_t)0x0) {
              update_live(puVar49[-5],iStack_2ac,(bitmap_t)pMStack_2a8->c2mir_ctx);
              ctx = pMStack_290;
              pMVar7 = ((DLIST_LINK_MIR_item_t *)&pMVar36->error_func)->prev;
              if (pMVar7 == (MIR_item_t)0x0) goto LAB_001720cc;
              uVar50 = (ulong)puVar49[-5];
              if ((uVar50 < (ulong)((long)pMVar7->data << 6)) &&
                 (pMVar7 = (pMVar7->item_link).prev, uVar22 = puVar49[-5] >> 6,
                 pbVar35 = (bb_t)(&pMVar7->data)[uVar22],
                 (&pMVar7->data)[uVar22] = (bb_t)((ulong)pbVar35 & ~(1L << (uVar50 & 0x3f))),
                 ((ulong)pbVar35 >> (uVar50 & 0x3f) & 1) != 0)) {
                spill_restore_reg(pgVar45,puVar49[-5],base_reg,(MIR_insn_t)pgVar42,1,0);
              }
            }
          }
        }
      }
      sVar52 = sVar52 + 1;
      puVar49 = puVar49 + 0xc;
    } while (sStack_280 != sVar52);
  }
  pMVar36 = pMStack_2a8;
  if (iVar24 != 0 || pMStack_2a8 == (MIR_context_t)0x0) goto LAB_00171238;
  target_get_early_clobbered_hard_regs
            ((MIR_insn_t)pgVar42,(MIR_reg_t *)&MStack_208,(MIR_reg_t *)&MStack_238);
  if ((MIR_reg_t)MStack_208.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_208.data,1,(bitmap_t)pMVar36->c2mir_ctx);
  }
  if ((MIR_reg_t)MStack_238.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_238.data,1,(bitmap_t)pMVar36->c2mir_ctx);
  }
  if (*(int *)&pgVar42->debug_file - 0xaaU < 0xfffffffd) goto LAB_00171238;
  pVVar5 = pgVar45->call_used_hard_regs[0x12];
  if (pVVar5 != (bitmap_t)0x0) {
    pMVar36 = pgVar42->ctx;
    uVar50 = 0;
    do {
      pMVar20 = pMStack_2a8;
      uVar37 = uVar50 >> 6;
      uVar29 = pVVar5->els_num;
      bVar53 = true;
      uVar43 = uVar50;
      if (uVar37 < uVar29) {
        uVar43 = uVar29 << 6;
LAB_00170f18:
        if ((pVVar5->varr[uVar37] == 0) ||
           (uVar46 = pVVar5->varr[uVar37] >> (uVar50 & 0x3f), uVar46 == 0)) goto LAB_00170f2b;
        uVar29 = uVar46 & 1;
        uStack_2b8 = uVar50;
        while (uVar29 == 0) {
          uStack_2b8 = uStack_2b8 + 1;
          uVar29 = uVar46 & 2;
          uVar46 = uVar46 >> 1;
        }
        uVar43 = uStack_2b8 + 1;
        bVar53 = false;
      }
LAB_00170f64:
      if (bVar53) goto LAB_00170f94;
      update_live((MIR_reg_t)uStack_2b8,1,(bitmap_t)pMStack_2a8->c2mir_ctx);
      uVar50 = uVar43;
      if (pVVar5 == (bitmap_t)0x0) break;
    } while( true );
  }
  rewrite_insn_cold_16();
  goto LAB_0017209a;
LAB_00170530:
  pgStack_40 = (gen_ctx_t)0x170535;
  gap_lr_spill_cost_cold_3();
LAB_00170535:
  pgStack_40 = (gen_ctx_t)0x17053a;
  gap_lr_spill_cost_cold_1();
  unaff_RBX = gen_ctx;
  unaff_R14 = (out_edge_t)lr;
  goto LAB_0017053a;
LAB_00170f2b:
  uVar37 = uVar37 + 1;
  uVar50 = uVar37 * 0x40;
  if (uVar29 == uVar37) goto LAB_00170f64;
  goto LAB_00170f18;
LAB_00170f94:
  pHVar9 = pMVar36->module_item_tab;
  if (pHVar9 != (HTAB_MIR_item_t *)0x0) {
    uVar50 = 0;
    do {
      uVar37 = uVar50 >> 6;
      uVar29._0_4_ = pHVar9->els_num;
      uVar29._4_4_ = pHVar9->els_start;
      bVar53 = true;
      uVar43 = uVar50;
      if (uVar37 < uVar29) {
        uVar43 = uVar29 << 6;
LAB_00170fc9:
        uVar46 = *(ulong *)((long)pHVar9->arg + uVar37 * 8);
        if ((uVar46 == 0) || (uVar46 = uVar46 >> (uVar50 & 0x3f), uVar46 == 0)) goto LAB_00170fdc;
        uVar29 = uVar46 & 1;
        uStack_2b8 = uVar50;
        while (uVar29 == 0) {
          uStack_2b8 = uStack_2b8 + 1;
          uVar29 = uVar46 & 2;
          uVar46 = uVar46 >> 1;
        }
        uVar43 = uStack_2b8 + 1;
        bVar53 = false;
      }
LAB_00171015:
      if (bVar53) goto LAB_0017103a;
      update_live((MIR_reg_t)uStack_2b8,0,(bitmap_t)pMVar20->c2mir_ctx);
      uVar50 = uVar43;
      if (pHVar9 == (HTAB_MIR_item_t *)0x0) break;
    } while( true );
  }
LAB_0017209a:
  rewrite_insn_cold_15();
LAB_0017209f:
  rewrite_insn_cold_14();
LAB_001720a4:
  rewrite_insn_cold_12();
LAB_001720a9:
  rewrite_insn_cold_13();
LAB_001720ae:
  rewrite_insn_cold_2();
LAB_001720b3:
  rewrite_insn_cold_8();
LAB_001720b8:
  rewrite_insn_cold_9();
LAB_001720bd:
  rewrite_insn_cold_6();
LAB_001720c2:
  rewrite_insn_cold_5();
LAB_001720c7:
  rewrite_insn_cold_11();
LAB_001720cc:
  rewrite_insn_cold_7();
LAB_001720d1:
  rewrite_insn_cold_4();
LAB_001720d6:
  rewrite_insn_cold_3();
LAB_001720db:
  rewrite_insn_cold_1();
LAB_001720e0:
  rewrite_insn_cold_10();
  goto LAB_001720e5;
LAB_00170fdc:
  uVar37 = uVar37 + 1;
  uVar50 = uVar37 * 0x40;
  if (uVar29 == uVar37) goto LAB_00171015;
  goto LAB_00170fc9;
LAB_0017103a:
  pbVar35 = (bb_t)pMVar20->c2mir_ctx;
  if (pbVar35 != (bb_t)0x0) {
    uVar50 = 0;
    do {
      uVar37 = uVar50 >> 6;
      uVar29 = pbVar35->index;
      bVar53 = true;
      uVar43 = uVar50;
      if (uVar37 < uVar29) {
        uVar43 = uVar29 << 6;
LAB_00171068:
        uVar46 = *(ulong *)(pbVar35->rpost + uVar37 * 8);
        if ((uVar46 == 0) || (uVar46 = uVar46 >> (uVar50 & 0x3f), uVar46 == 0)) goto LAB_0017107b;
        uVar29 = uVar46 & 1;
        uStack_2b8 = uVar50;
        while (uVar29 == 0) {
          uStack_2b8 = uStack_2b8 + 1;
          uVar29 = uVar46 & 2;
          uVar46 = uVar46 >> 1;
        }
        uVar43 = uStack_2b8 + 1;
        bVar53 = false;
      }
LAB_001710b4:
      if (bVar53) goto LAB_00171238;
      if (0x21 < uStack_2b8) {
        pVVar5 = pMStack_2a8->gen_ctx->call_used_hard_regs[2];
        if (pVVar5 == (bitmap_t)0x0) goto LAB_001720a9;
        uVar50 = uStack_2b8 & 0xffffffff;
        if ((pVVar5->els_num << 6 <= uVar50) ||
           ((pVVar5->varr[(uint)uStack_2b8 >> 6] >> (uStack_2b8 & 0x3f) & 1) == 0)) {
          pVVar10 = pgVar45->ra_ctx->reg_renumber;
          if ((pVVar10 == (VARR_MIR_reg_t *)0x0) ||
             ((pVVar10->varr == (MIR_reg_t *)0x0 || (pVVar10->els_num <= uVar50))))
          goto LAB_001720a4;
          uVar29 = (ulong)pVVar10->varr[uVar50];
          if (uVar29 < 0x22) {
            MIR_reg_type(pgVar45->ctx,(uint)uStack_2b8 - 0x21,(pgVar45->curr_func_item->u).func);
            ctx = pMStack_290;
            pVVar5 = pgVar45->call_used_hard_regs[0x12];
            if (pVVar5 == (bitmap_t)0x0) goto LAB_001720c7;
            if ((uVar29 < pVVar5->els_num << 6) && ((*pVVar5->varr >> (uVar29 & 0x3f) & 1) != 0)) {
              pMVar7 = ((DLIST_LINK_MIR_item_t *)&pMStack_2a8->error_func)->prev;
              bitmap_expand((bitmap_t)pMVar7,uVar50 + 1);
              if (pMVar7 == (MIR_item_t)0x0) goto LAB_001720e0;
              pMVar7 = (pMVar7->item_link).prev;
              pbVar11 = (bb_t)(&pMVar7->data)[(uint)uStack_2b8 >> 6];
              (&pMVar7->data)[(uint)uStack_2b8 >> 6] =
                   (bb_t)((ulong)pbVar11 | 1L << (uStack_2b8 & 0x3f));
              if (((ulong)pbVar11 >> (uStack_2b8 & 0x3f) & 1) == 0) {
                spill_restore_reg(pgVar45,(uint)uStack_2b8,base_reg,(MIR_insn_t)pgVar42,1,1);
              }
            }
          }
        }
      }
      uVar50 = uVar43;
      if (pbVar35 == (bb_t)0x0) break;
    } while( true );
  }
  goto LAB_0017209f;
LAB_0017107b:
  uVar37 = uVar37 + 1;
  uVar50 = uVar37 * 0x40;
  if (uVar29 == uVar37) goto LAB_001710b4;
  goto LAB_00171068;
LAB_00171238:
  bVar53 = iVar24 != 0;
  iVar24 = iVar24 + 1;
  if (bVar53) goto code_r0x00171245;
  goto LAB_00170986;
code_r0x00171245:
  prVar12 = pgVar45->ra_ctx;
  prVar12->in_reloads_num = 0;
  prVar12->out_reloads_num = 0;
  if ((int)uStack_288 < 3) {
LAB_0017165a:
    bVar53 = *(int *)&pgVar42->debug_file - 0x22U < 0xfffffffc;
    if (!bVar53) {
      if (bVar53) {
        __assert_fail("MIR_addr_code_p (insn->code)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f03,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      if (*(char *)&pgVar42->temp_bitmap2 != '\x02') {
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar22 = *(uint *)&pgVar42->temp_bitmap3;
      if (0xffffffdc < uVar22 - 0x22) {
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar10 = pgVar45->ra_ctx->reg_renumber;
      if (((pVVar10 == (VARR_MIR_reg_t *)0x0) || (pVVar10->varr == (MIR_reg_t *)0x0)) ||
         (pVVar10->els_num <= (ulong)uVar22)) goto LAB_00172195;
      pMVar36 = pgVar45->ctx;
      uVar44 = pVVar10->varr[uVar22];
      MVar26 = MIR_reg_type(pMVar36,uVar22 - 0x21,(pgVar45->curr_func_item->u).func);
      if (uVar44 < 0x22) {
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar44 = uVar44 - 0x22;
      if (pgVar45->target_ctx->keep_fp_p == '\0') {
        lVar40 = (ulong)uVar44 << 3;
      }
      else {
        lVar40 = -0xb0;
        if (((pgVar45->curr_func_item->u).func)->vararg_p == '\0') {
          lVar40 = 0;
        }
        lVar40 = lVar40 + (ulong)((MVar26 == MIR_T_LD) + 1 + uVar44) * -8;
      }
      MVar27 = get_reload_hreg(pgVar45,0xffffffff,6,0);
      _MIR_new_var_op(pMVar36,MVar27);
      iVar31 = _MIR_addr_offset(pMVar36,*(MIR_insn_code_t *)&pgVar42->debug_file);
      MIR_new_int_op(pMVar36,lVar40 + iVar31);
      pMVar30 = MIR_new_insn(pMVar36,MIR_MOV);
      _MIR_new_var_op(pMVar36,MVar27);
      _MIR_new_var_op(pMVar36,MVar27);
      _MIR_new_var_op(pMVar36,base_reg);
      insn = MIR_new_insn(pMVar36,MIR_ADD);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        if (pgVar45->optimize_level == 0) {
          uVar22 = *(int *)&pgVar42->debug_file - 0xa7;
          pgVar32 = pgVar42;
          if ((uVar22 < 0xe) && ((0x2007U >> (uVar22 & 0x1f) & 1) != 0)) {
            pgVar32 = (gen_ctx_t)pgVar42->ctx;
          }
        }
        else {
          pgVar32 = (gen_ctx_t)&pgVar42->ctx->temp_string;
        }
        fprintf((FILE *)pgVar45->debug_file,"    Adding before insn (in BB %lu) ",
                pgVar32->ctx->gen_ctx);
        MIR_output_insn(pMVar36,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar42,
                        (pgVar45->curr_func_item->u).func,0);
        fwrite(":\n      ",8,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar36,pgVar45->debug_file,pMVar30,(pgVar45->curr_func_item->u).func,1);
        fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar36,pgVar45->debug_file,insn,(pgVar45->curr_func_item->u).func,1);
      }
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar42,pMVar30);
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar42,insn);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("Changing ",9,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar36,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar42,
                        (pgVar45->curr_func_item->u).func,0);
      }
      *(undefined4 *)&pgVar42->debug_file = 0;
      _MIR_new_var_op(pMVar36,MVar27);
      auVar3._16_16_ = auStack_138;
      auVar3._0_16_ = auStack_148;
      pgVar42->temp_bitmap3 = (bitmap_t)auStack_138._0_8_;
      pgVar42->call_used_hard_regs[0] = (bitmap_t)auStack_138._8_8_;
      pgVar42->call_used_hard_regs[1] = (bitmap_t)auStack_128._0_8_;
      pgVar42->call_used_hard_regs[2] = (bitmap_t)auStack_128._8_8_;
      *(undefined1 (*) [32])&pgVar42->temp_bitmap = auVar3;
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite(" to ",4,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar36,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar42,
                        (pgVar45->curr_func_item->u).func,1);
      }
    }
    if (sStack_280 != 0) {
      uVar22 = *(int *)&pgVar42->debug_file - 0xaa;
      sVar52 = 0;
      pMStack_2a8 = (MIR_context_t)CONCAT44(pMStack_2a8._4_4_,uVar22);
      do {
        pDVar48 = pDStack_2a0 + sVar52 * 3;
        MVar25 = MIR_insn_op_mode(pMStack_290,(MIR_insn_t_conflict)pgVar42,sVar52,&iStack_2ac);
        if ((pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
          pauVar33 = (undefined1 (*) [32])&pbStack_1d8;
          if (iStack_2ac == 0) {
            pauVar33 = (undefined1 (*) [32])&pbStack_1a8;
          }
          auVar3 = *(undefined1 (*) [32])pDVar48;
          *(undefined1 (*) [32])(*pauVar33 + 0x10) = *(undefined1 (*) [32])(pDVar48 + 1);
          *pauVar33 = auVar3;
        }
        if (*(char *)&pDVar48->next == '\v') {
          if ((uVar22 < 0xfffffffd) ||
             (*(byte *)&((DLIST_in_edge_t *)(pDVar48 + 1))->head - 0x11 < 0xfffffffb)) {
            if (0x22 < *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar48 + 2))->head + 1) {
              MVar27 = change_reg(pgVar45,&MStack_278,
                                  *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar48 + 2))->head,base_reg,
                                  MIR_OP_INT,(MIR_insn_t)pgVar42,0);
              *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar48 + 2))->head = MVar27;
              if (MVar27 == 0xffffffff) {
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar27 = *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar48 + 2))->head + 4);
            if (0x22 < MVar27 + 1) {
              MVar27 = change_reg(pgVar45,&MStack_278,MVar27,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar42
                                  ,0);
              *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar48 + 2))->head + 4) = MVar27;
              if (MVar27 == 0xffffffff) {
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((*(char *)&pDVar48->next == '\x02') &&
                (0x21 < *(uint *)&((DLIST_in_edge_t *)(pDVar48 + 1))->head)) {
          if (MVar25 == MIR_OP_VAR) {
            if ((*(int *)&pgVar42->debug_file != 0xb9) &&
               ((sVar52 != 1 || (3 < *(int *)&pgVar42->debug_file - 0x1eU)))) goto LAB_0017219a;
            MVar26 = MIR_reg_type(pMStack_290,
                                  *(uint *)&((DLIST_in_edge_t *)(pDVar48 + 1))->head - 0x21,
                                  (pgVar45->curr_func_item->u).func);
            if (MVar26 == MIR_T_F) {
              MVar25 = MIR_OP_FLOAT;
            }
            else if (MVar26 == MIR_T_D) {
              MVar25 = MIR_OP_DOUBLE;
            }
            else {
              MVar25 = (uint)(MVar26 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar10 = pgVar45->ra_ctx->reg_renumber;
          if (((pVVar10 == (VARR_MIR_reg_t *)0x0) || (pVVar10->varr == (MIR_reg_t *)0x0)) ||
             (pVVar10->els_num <= (ulong)*(uint *)&((DLIST_in_edge_t *)(pDVar48 + 1))->head)) {
LAB_001720e5:
            rewrite_insn_cold_18();
LAB_001720ed:
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar52 == 0) && (*(int *)&pgVar42->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar44 = pVVar10->varr[*(uint *)&((DLIST_in_edge_t *)(pDVar48 + 1))->head],
             0x21 < uVar44)) {
            pMVar36 = pgVar45->ctx;
            MVar26 = MIR_reg_type(pMVar36,*(int *)&((DLIST_in_edge_t *)&pgVar42->addr_insn_p)->head
                                          - 0x21,(pgVar45->curr_func_item->u).func);
            uVar44 = uVar44 - 0x22;
            if (pgVar45->target_ctx->keep_fp_p == '\0') {
              disp = (ulong)uVar44 << 3;
            }
            else {
              lVar40 = -0xb0;
              if (((pgVar45->curr_func_item->u).func)->vararg_p == '\0') {
                lVar40 = 0;
              }
              disp = lVar40 + (ulong)((MVar26 == MIR_T_LD) + 1 + uVar44) * -8;
            }
            iVar24 = *(int *)&((DLIST_in_edge_t *)&pgVar42->addr_insn_p)->head;
            auVar3 = *(undefined1 (*) [32])pDStack_2a0;
            MStack_208.u._16_8_ = SUB328(*(undefined1 (*) [32])(pDStack_2a0 + 1),0x10);
            MStack_208.u.mem.disp = SUB328(*(undefined1 (*) [32])(pDStack_2a0 + 1),0x18);
            MStack_208.data._0_4_ = auVar3._0_4_;
            MStack_208.data._4_4_ = auVar3._4_4_;
            MStack_208._8_8_ = auVar3._8_8_;
            MStack_208.u.i = auVar3._16_8_;
            MStack_208.u.str.s = auVar3._24_8_;
            _MIR_new_var_mem_op(&MStack_238,pMVar36,MVar26,disp,base_reg,0xffffffff,'\0');
            pFVar13 = pgVar42->debug_file;
            if ((int)((ulong)pFVar13 >> 0x20) < 1) {
              uVar22 = 0;
            }
            else {
              uVar50 = 0;
              uVar22 = 0;
              pDVar38 = (DLIST_in_edge_t *)&pgVar42->addr_insn_p;
              do {
                if ((*(char *)&((DLIST_LINK_bb_t *)(pDVar38 + -1))->next == '\x02') &&
                   (*(int *)&pDVar38->head == iVar24)) {
                  auVar16._4_4_ = MStack_238.data._4_4_;
                  auVar16._0_4_ = (MIR_reg_t)MStack_238.data;
                  auVar16._8_8_ = MStack_238._8_8_;
                  auVar16._16_8_ = MStack_238.u.i;
                  auVar16._24_8_ = MStack_238.u.str.s;
                  auVar17._8_8_ = MStack_238.u.str.s;
                  auVar17._0_8_ = MStack_238.u.i;
                  auVar17._16_8_ = MStack_238.u._16_8_;
                  auVar17._24_8_ = MStack_238.u.mem.disp;
                  *(undefined1 (*) [32])pDVar38 = auVar17;
                  *(undefined1 (*) [32])(pDVar38 + -1) = auVar16;
                  if (1 < (int)uVar22) goto LAB_001720ed;
                  lVar40 = (long)(int)uVar22;
                  uVar22 = uVar22 + 1;
                  aiStack_178[lVar40] = (int)uVar50;
                }
                uVar50 = uVar50 + 1;
                pDVar38 = pDVar38 + 3;
              } while ((ulong)pFVar13 >> 0x20 != uVar50);
            }
            iVar24 = find_insn_pattern(pgVar45,(MIR_insn_t)pgVar42,(int *)0x0);
            if (0 < (int)uVar22 && iVar24 < 0) {
              uVar50 = 0;
              do {
                iVar23 = aiStack_178[uVar50];
                auVar18._4_4_ = MStack_208.data._4_4_;
                auVar18._0_4_ = (MIR_reg_t)MStack_208.data;
                auVar18._8_8_ = MStack_208._8_8_;
                auVar18._16_8_ = MStack_208.u.i;
                auVar18._24_8_ = MStack_208.u.str.s;
                auVar19._8_8_ = MStack_208.u.str.s;
                auVar19._0_8_ = MStack_208.u.i;
                auVar19._16_8_ = MStack_208.u._16_8_;
                auVar19._24_8_ = MStack_208.u.mem.disp;
                *(undefined1 (*) [32])(pDStack_2a0 + (long)iVar23 * 3 + 1) = auVar19;
                *(undefined1 (*) [32])(pDStack_2a0 + (long)iVar23 * 3) = auVar18;
                uVar50 = uVar50 + 1;
              } while (uVar22 != uVar50);
            }
            uVar22 = (uint)pMStack_2a8;
            if (-1 < iVar24) goto LAB_00171ebc;
          }
          MVar27 = change_reg(pgVar45,&MStack_278,
                              *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar48 + 1))->head,base_reg,
                              MVar25,(MIR_insn_t)pgVar42,iStack_2ac);
          if (MVar27 == 0xffffffff) {
            auVar14._8_8_ = MStack_278._8_8_;
            auVar14._0_8_ = MStack_278.data;
            auVar14._16_8_ = MStack_278.u.i;
            auVar14._24_8_ = MStack_278.u.str.s;
            auVar15._8_8_ = MStack_278.u.str.s;
            auVar15._0_8_ = MStack_278.u.i;
            auVar15._16_8_ = MStack_278.u._16_8_;
            auVar15._24_8_ = MStack_278.u.mem.disp;
            *(undefined1 (*) [32])(pDVar48 + 1) = auVar15;
            *(undefined1 (*) [32])pDVar48 = auVar14;
          }
          else {
            *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar48 + 1))->head = MVar27;
          }
        }
LAB_00171ebc:
        sVar52 = sVar52 + 1;
      } while (sVar52 != sStack_280);
    }
    pDVar48 = pDStack_2a0;
    iVar24 = 0;
    if ((((ulong)pgVar42->debug_file & 0xfffffffc) == 0) &&
       (op1_00._12_4_ = (int)((ulong)pgVar42->to_free >> 0x20),
       op1_00._0_12_ = *(undefined1 (*) [12])&pgVar42->debug_level,
       op1_00.u.i = (int64_t)((DLIST_in_edge_t *)&pgVar42->addr_insn_p)->head,
       op1_00.u.mem.nonalias = (int)(in_edge_t_conflict)pgVar42->tied_regs,
       op1_00.u.mem.nloc = (int)((ulong)pgVar42->tied_regs >> 0x20),
       op1_00.u._16_8_ = ((DLIST_out_edge_t *)&pgVar42->addr_regs)->head,
       op1_00.u.mem.disp = (MIR_disp_t)pgVar42->insn_to_consider,
       iVar23 = MIR_op_eq_p(pMStack_290,op1_00,*(MIR_op_t *)&pgVar42->temp_bitmap), iVar24 = 0,
       iVar23 != 0)) {
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar45->debug_file);
        pMVar36 = pMStack_290;
        MIR_output_insn(pMStack_290,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar42,
                        (pgVar45->curr_func_item->u).func,0);
        fwrite(" which was ",0xb,1,(FILE *)pgVar45->debug_file);
        ((DLIST_in_edge_t *)(pDVar48 + 1))->head = peStack_1c8;
        ((DLIST_in_edge_t *)(pDVar48 + 1))->tail = peStack_1c0;
        ((DLIST_out_edge_t *)(pDVar48 + 2))->head = peStack_1b8;
        ((DLIST_out_edge_t *)(pDVar48 + 2))->tail = peStack_1b0;
        pDVar48->prev = pbStack_1d8;
        pDVar48->next = pbStack_1d0;
        ((DLIST_in_edge_t *)(pDVar48 + 1))->head = peStack_1c8;
        ((DLIST_in_edge_t *)(pDVar48 + 1))->tail = peStack_1c0;
        pgVar42->temp_bitmap3 = pVStack_198;
        pgVar42->call_used_hard_regs[0] = pVStack_190;
        pgVar42->call_used_hard_regs[1] = pVStack_188;
        pgVar42->call_used_hard_regs[2] = pVStack_180;
        ((DLIST_bb_insn_t *)&pgVar42->temp_bitmap)->head = pbStack_1a8;
        pgVar42->temp_bitmap2 = (bitmap_t)pbStack_1a0;
        pgVar42->temp_bitmap3 = pVStack_198;
        pgVar42->call_used_hard_regs[0] = pVStack_190;
        MIR_output_insn(pMVar36,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar42,
                        (pgVar45->curr_func_item->u).func,1);
      }
      if ((((pgVar45->optimize_level != 0) &&
           (pMVar36 = pgVar42->ctx, pMVar36 != (MIR_context_t)0x0)) &&
          ((MIR_context_t)pMVar36->temp_string[3].size == pMVar36)) &&
         ((MIR_context_t)pMVar36->temp_string[3].varr == pMVar36)) {
        pMVar30 = MIR_new_insn_arr(pgVar45->ctx,MIR_USE,0,(MIR_op_t *)0x0);
        MIR_insert_insn_before
                  (pgVar45->ctx,pgVar45->curr_func_item,(MIR_insn_t_conflict)pMVar36->gen_ctx,
                   pMVar30);
        add_new_bb_insn(pgVar45,pMVar30,(bb_t_conflict)pMVar36->temp_string,0);
      }
      gen_delete_insn(pgVar45,(MIR_insn_t)pgVar42);
      iVar24 = 1;
    }
    return iVar24;
  }
  if ((int)(uStack_2d4 & uStack_294) < 0) {
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar36 = pgVar45->ctx;
  uVar22 = uStack_2d4;
  if (-1 < (int)uStack_294) {
    uVar22 = uStack_294;
  }
  lVar40 = (long)(int)uVar22;
  uVar22 = *(uint *)&pDStack_2a0[lVar40 * 3 + 2].prev;
  uVar43 = (ulong)*(uint *)((long)&pDStack_2a0[lVar40 * 3 + 2].prev + 4);
  uVar50 = (ulong)uStack_2d4;
  uVar29 = (ulong)uStack_294;
  if (-1 < (int)(uStack_2d4 | uStack_294)) {
    pDVar48 = pDStack_2a0 + uVar50 * 3;
    op1._12_4_ = (int)((ulong)pDVar48->next >> 0x20);
    op1._0_12_ = *(undefined1 (*) [12])pDVar48;
    op1.u.i = (int64_t)((DLIST_in_edge_t *)(pDVar48 + 1))->head;
    op1.u.mem.nonalias = (int)((DLIST_in_edge_t *)(pDVar48 + 1))->tail;
    op1.u.mem.nloc = (int)((ulong)((DLIST_in_edge_t *)(pDVar48 + 1))->tail >> 0x20);
    op1.u._16_8_ = pDStack_2a0[uVar50 * 3 + 2].prev;
    op1.u.mem.disp = (MIR_disp_t)pDStack_2a0[uVar50 * 3 + 2].next;
    op2.u._16_8_ = pDStack_2a0[uVar29 * 3 + 2].prev;
    op2._0_32_ = *(undefined1 (*) [32])(pDStack_2a0 + uVar29 * 3);
    op2.u.mem.disp = (MIR_disp_t)pDStack_2a0[uVar29 * 3 + 2].next;
    iVar24 = MIR_op_eq_p(pMVar36,op1,op2);
    if (iVar24 == 0) {
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
  }
  pVVar10 = pgVar45->ra_ctx->reg_renumber;
  if (((pVVar10 == (VARR_MIR_reg_t *)0x0) || (pVVar10->varr == (MIR_reg_t *)0x0)) ||
     (pVVar10->els_num <= (ulong)uVar22)) {
    rewrite_insn_cold_20();
  }
  else {
    add_ld_st(pgVar45,&MStack_208,pVVar10->varr[uVar22],base_reg,MIR_OP_INT,10,0,10,
              (MIR_insn_t)pgVar42,0);
    pDVar48 = pDStack_2a0;
    pVVar10 = pgVar45->ra_ctx->reg_renumber;
    if (((pVVar10 != (VARR_MIR_reg_t *)0x0) && (pVVar10->varr != (MIR_reg_t *)0x0)) &&
       (uVar43 < pVVar10->els_num)) {
      add_ld_st(pgVar45,&MStack_208,pVVar10->varr[uVar43],base_reg,MIR_OP_INT,0xb,0,0xb,
                (MIR_insn_t)pgVar42,0);
      _MIR_new_var_op(pMVar36,10);
      _MIR_new_var_op(pMVar36,0xb);
      bVar4 = *(byte *)((long)&pDVar48[lVar40 * 3 + 1].prev + 1);
      uVar43 = (ulong)bVar4;
      if (bVar4 == 0) {
        iVar31 = -1;
LAB_00171476:
        MIR_new_int_op(pMVar36,iVar31);
        pMVar30 = MIR_new_insn(pMVar36,MIR_LSH);
        gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar42,pMVar30);
        if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
          fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
          MIR_output_insn(pMVar36,pgVar45->debug_file,pMVar30,(pgVar45->curr_func_item->u).func,1);
        }
      }
      else if (bVar4 != 1) {
        lVar40 = 0;
        uVar37 = uVar43;
        if ((bVar4 & 1) == 0) {
          do {
            lVar40 = lVar40 + 1;
            uVar43 = uVar37 >> 1;
            uVar46 = uVar37 & 2;
            uVar37 = uVar43;
          } while (uVar46 == 0);
        }
        iVar31 = -1;
        if (uVar43 == 1) {
          iVar31 = lVar40;
        }
        goto LAB_00171476;
      }
      pMVar30 = MIR_new_insn(pMVar36,MIR_ADD);
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar42,pMVar30);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar36,pgVar45->debug_file,pMVar30,(pgVar45->curr_func_item->u).func,1);
      }
      if (-1 < (int)uStack_294) {
        pDStack_2a0[uVar29 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      if (-1 < (int)uStack_2d4) {
        pDStack_2a0[uVar50 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      get_reload_hreg(pgVar45,0xffffffff,6,0);
      goto LAB_0017165a;
    }
  }
  rewrite_insn_cold_19();
LAB_00172195:
  rewrite_insn_cold_17();
LAB_0017219a:
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
}

Assistant:

static int gap_lr_spill_cost (gen_ctx_t gen_ctx, live_range_t lr) {
  int cost_factor = LOOP_COST_FACTOR / 2;
  bitmap_clear (temp_bitmap);
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next)
    bitmap_set_bit_p (temp_bitmap, lr_bb->bb->index);
  int cost = 0;
  for (lr_bb_t lr_bb = lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next) {
    bb_t bb = lr_bb->bb;
    int level, max_level, bb_level = bb_loop_level (bb) + 1;
    edge_t e;
    max_level = -1;
    for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->dst->index)
          && (level = bb_loop_level (e->dst) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
    max_level = -1;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (!bitmap_bit_p (temp_bitmap, e->src->index)
          && (level = bb_loop_level (e->src) + 1) > max_level)
        max_level = level;
    if (max_level >= 0) cost += (max_level < bb_level ? max_level : bb_level) * cost_factor;
  }
  return cost;
}